

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

DynamicHistogram<double> * __thiscall
StatisticsTracker::getHistogram
          (DynamicHistogram<double> *__return_storage_ptr__,StatisticsTracker *this)

{
  StatisticsTracker *this_local;
  
  DynamicHistogram<double>::DynamicHistogram(__return_storage_ptr__,&this->_histogram);
  return __return_storage_ptr__;
}

Assistant:

DynamicHistogram<double>
    getHistogram(void) const
    {
        return this->_histogram;
    }